

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

sexp_conflict check_exception(sexp_conflict ctx,sexp_conflict res)

{
  long lVar1;
  undefined8 uVar2;
  int *piVar3;
  sexp_conflict in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict sym;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict advise;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict err;
  sexp_conflict *local_70;
  undefined8 local_68;
  sexp_conflict local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  int **local_40;
  undefined8 local_38;
  int *local_30;
  int **local_28;
  undefined8 local_20;
  int *local_18;
  sexp_conflict local_10;
  long local_8;
  
  local_18 = (int *)0x43e;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_28,0,0x10);
  local_30 = (int *)&DAT_0000043e;
  memset(&local_40,0,0x10);
  local_48 = 0x43e;
  memset(&local_58,0,0x10);
  local_60 = (sexp_conflict)0x43e;
  memset(&local_70,0,0x10);
  lVar1 = local_8;
  if (((local_10 != (sexp_conflict)0x0) && (((ulong)local_10 & 3) == 0)) && (local_10->tag == 0x13))
  {
    local_28 = &local_18;
    local_20 = *(undefined8 *)(local_8 + 0x6080);
    *(int ****)(local_8 + 0x6080) = &local_28;
    local_40 = &local_30;
    local_38 = *(undefined8 *)(local_8 + 0x6080);
    *(int ****)(local_8 + 0x6080) = &local_40;
    local_58 = &local_48;
    local_50 = *(undefined8 *)(local_8 + 0x6080);
    *(undefined8 ***)(local_8 + 0x6080) = &local_58;
    local_70 = &local_60;
    local_68 = *(undefined8 *)(local_8 + 0x6080);
    *(sexp_conflict ***)(local_8 + 0x6080) = &local_70;
    local_60 = local_10;
    uVar2 = sexp_env_ref(local_8,*(undefined8 *)(local_8 + 0x10),
                         *(undefined8 *)(*(long *)(local_8 + 0x28) + 0xd0),0x3e);
    local_18 = (int *)sexp_parameter_ref(lVar1,uVar2);
    if ((((ulong)local_18 & 3) != 0) || (*local_18 != 0x11)) {
      local_18 = (int *)sexp_make_output_port(local_8,_stderr,0x3e);
    }
    sexp_print_exception_op(local_8,0,2,local_10,local_18);
    sexp_print_exception_stack_trace_op(local_8,0,2,local_10,local_18);
    if ((((*(ulong *)(*(long *)(local_8 + 0x28) + 0x68) & 3) == 0) &&
        (**(int **)(*(long *)(local_8 + 0x28) + 0x68) == 0x17)) &&
       ((local_30 = (int *)sexp_eval_string(local_8,"(load-module \'(chibi repl))",
                                            0xffffffffffffffff,
                                            *(undefined8 *)(*(long *)(local_8 + 0x28) + 0x68)),
        ((ulong)local_30 & 3) == 0 &&
        (((*local_30 == 10 && (local_30 = *(int **)(local_30 + 6), ((ulong)local_30 & 3) == 0)) &&
         (*local_30 == 0x17)))))) {
      local_48 = sexp_intern(local_8,"repl-advise-exception",0xffffffffffffffff);
      piVar3 = (int *)sexp_env_ref(local_8,local_30,local_48,0x3e);
      lVar1 = local_8;
      local_30 = piVar3;
      if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x14)) {
        local_60 = (sexp_conflict)sexp_list2(local_8,local_10,local_18);
        sexp_apply(lVar1,piVar3);
      }
    }
    *(undefined8 *)(local_8 + 0x6080) = local_20;
    exit(0x46);
  }
  return local_10;
}

Assistant:

static sexp check_exception (sexp ctx, sexp res) {
  sexp_gc_var4(err, advise, sym, tmp);
  if (res && sexp_exceptionp(res)) {
    sexp_gc_preserve4(ctx, err, advise, sym, tmp);
    tmp = res;
    err = sexp_current_error_port(ctx);
    if (! sexp_oportp(err))
      err = sexp_make_output_port(ctx, stderr, SEXP_FALSE);
    sexp_print_exception(ctx, res, err);
    sexp_print_exception_stack_trace(ctx, res, err);
#if SEXP_USE_MAIN_ERROR_ADVISE
    if (sexp_envp(sexp_global(ctx, SEXP_G_META_ENV))) {
      advise = sexp_eval_string(ctx, sexp_advice_environment, -1, sexp_global(ctx, SEXP_G_META_ENV));
      if (sexp_vectorp(advise)) {
        advise = sexp_vector_ref(advise, SEXP_ONE);
        if (sexp_envp(advise)) {
          sym = sexp_intern(ctx, "repl-advise-exception", -1);
          advise = sexp_env_ref(ctx, advise, sym, SEXP_FALSE);
          if (sexp_procedurep(advise))
            sexp_apply(ctx, advise, tmp=sexp_list2(ctx, res, err));
        }
      }
    }
#endif
    sexp_gc_release4(ctx);
    exit_failure();
  }
  return res;
}